

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8Codex.cpp
# Opt level: O1

size_t utf8::CharacterIndexToByteIndex
                 (LPCUTF8 pch,size_t cbLength,charcount_t cchIndex,size_t cbStartIndex,
                 charcount_t cchStartIndex,DecodeOptions options)

{
  uint *end;
  uint uVar1;
  uint *puVar2;
  size_t sVar3;
  uint uVar4;
  bool bVar5;
  DecodeOptions local_3c;
  uint *puStack_38;
  DecodeOptions localOptions;
  LPCUTF8 pchCurrent;
  
  puStack_38 = (uint *)(pch + cbStartIndex);
  end = (uint *)(pch + cbLength);
  uVar4 = cchIndex - cchStartIndex;
  puVar2 = puStack_38;
  local_3c = options;
  if (((ulong)puStack_38 & 3) != 0) goto LAB_006964db;
LAB_006964b2:
  if ((puVar2 < pch + (cbLength - 4)) && (4 < uVar4)) goto code_r0x006964bd;
  goto LAB_006964db;
code_r0x006964bd:
  uVar1 = *puVar2;
  if ((uVar1 & 0x80808080) == 0) {
    puVar2 = puVar2 + 1;
    uVar4 = uVar4 - 4;
    puStack_38 = puVar2;
  }
  if ((uVar1 & 0x80808080) != 0) {
LAB_006964db:
    bVar5 = uVar4 != 0;
    if ((end <= puStack_38) || (uVar4 == 0)) {
LAB_0069653d:
      sVar3 = (long)puStack_38 - (long)pch;
      if (bVar5) {
        sVar3 = cbLength;
      }
      return sVar3;
    }
    while( true ) {
      uVar4 = uVar4 - 1;
      puVar2 = (uint *)((long)puStack_38 + 1);
      uVar1 = *puStack_38;
      puStack_38 = puVar2;
      if ((char)(byte)uVar1 < '\0') {
        DecodeTail((ushort)(byte)uVar1,(LPCUTF8 *)&stack0xffffffffffffffc8,(LPCUTF8)end,&local_3c,
                   (bool *)0x0);
      }
      if ((4 < uVar4) && (puVar2 = puStack_38, ((ulong)puStack_38 & 3) == 0)) break;
      bVar5 = uVar4 != 0;
      if ((end <= puStack_38) || (!bVar5)) goto LAB_0069653d;
    }
  }
  goto LAB_006964b2;
}

Assistant:

size_t CharacterIndexToByteIndex(__in_ecount(cbLength) LPCUTF8 pch, size_t cbLength, const charcount_t cchIndex, size_t cbStartIndex, charcount_t cchStartIndex, DecodeOptions options)
    {
        DecodeOptions localOptions = options;
        LPCUTF8 pchCurrent = pch + cbStartIndex;
        LPCUTF8 pchEnd = pch + cbLength;
        LPCUTF8 pchEndMinus4 = pch + (cbLength - 4);
        charcount_t i = cchIndex - cchStartIndex;

        // Avoid using a reinterpret_cast to start a misaligned read.
        if (!IsAligned(pchCurrent)) goto LSlowPath;
LFastPath:
        // Skip 4 bytes at a time.
        while (pchCurrent < pchEndMinus4 && i > 4)
        {
            uint32 ch4 = *reinterpret_cast<const uint32 *>(pchCurrent);
            if ((ch4 & 0x80808080) == 0)
            {
                pchCurrent += 4;
                i -= 4;
            }
            else break;
        }

LSlowPath:
        while (pchCurrent < pchEnd && i > 0)
        {
            Decode(pchCurrent, pchEnd, localOptions);
            i--;

            // Try to return to the fast path avoiding misaligned reads.
            if (i > 4 && IsAligned(pchCurrent)) goto LFastPath;
        }
        return i > 0 ? cbLength : pchCurrent - pch;
    }